

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O2

void __thiscall ncnn::CopyTo::CopyTo(CopyTo *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__CopyTo_0058bd00;
  (this->axes).cstep = 0;
  (this->super_Layer).one_blob_only = false;
  (this->super_Layer).support_inplace = false;
  (this->starts).data = (void *)0x0;
  (this->starts).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->starts).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->starts).elemsize + 4) = 0;
  (this->starts).allocator = (Allocator *)0x0;
  (this->starts).dims = 0;
  (this->starts).w = 0;
  (this->starts).w = 0;
  (this->starts).h = 0;
  (this->starts).d = 0;
  (this->starts).c = 0;
  (this->axes).elempack = 0;
  (this->starts).cstep = 0;
  (this->axes).data = (void *)0x0;
  (this->axes).refcount = (int *)0x0;
  (this->axes).elemsize = 0;
  (this->axes).allocator = (Allocator *)0x0;
  (this->axes).dims = 0;
  (this->axes).w = 0;
  (this->axes).w = 0;
  (this->axes).h = 0;
  (this->axes).d = 0;
  (this->axes).c = 0;
  return;
}

Assistant:

CopyTo::CopyTo()
{
    one_blob_only = false;
    support_inplace = false;
}